

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# WordEmbedding.pb.cc
# Opt level: O0

void __thiscall
CoreML::Specification::CoreMLModels::WordEmbedding::CopyFrom
          (WordEmbedding *this,WordEmbedding *from)

{
  WordEmbedding *from_local;
  WordEmbedding *this_local;
  
  if (from != this) {
    Clear(this);
    MergeFrom(this,from);
  }
  return;
}

Assistant:

void WordEmbedding::CopyFrom(const WordEmbedding& from) {
// @@protoc_insertion_point(class_specific_copy_from_start:CoreML.Specification.CoreMLModels.WordEmbedding)
  if (&from == this) return;
  Clear();
  MergeFrom(from);
}